

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O1

int __thiscall tetgenmesh::segfacetadjacent(tetgenmesh *this,face *subseg,face *subsh)

{
  uint *puVar1;
  int iVar2;
  point pdVar3;
  point pdVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  iVar8 = *(int *)((long)subseg->sh + (long)this->shmarkindex * 4 + 8);
  pdVar3 = this->segmentendpointslist[(long)iVar8 * 2];
  pdVar4 = this->segmentendpointslist[iVar8 * 2 + 1];
  puVar1 = (uint *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 | 1;
  puVar1 = (uint *)((long)pdVar4 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 | 1;
  lVar6 = (long)*(int *)((long)subsh->sh + (long)this->shmarkindex * 4 + 8);
  iVar8 = this->idx2facetlist[lVar6];
  lVar7 = (long)iVar8;
  iVar2 = this->idx2facetlist[lVar6 + 1];
  uVar5 = 0;
  if (iVar8 < iVar2) {
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (*(uint *)((long)this->facetverticeslist[lVar7] +
                                (long)this->pointmarkindex * 4 + 4) & 1);
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
    uVar5 = (uint)(iVar8 == 1);
  }
  puVar1 = (uint *)((long)pdVar3 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 & 0xfffffffe;
  puVar1 = (uint *)((long)pdVar4 + (long)this->pointmarkindex * 4 + 4);
  *puVar1 = *puVar1 & 0xfffffffe;
  return uVar5;
}

Assistant:

inline int tetgenmesh::getfacetindex(face& s)
{
  return ((int *) (s.sh))[shmarkindex + 2];
}